

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr.hpp
# Opt level: O0

void __thiscall
duckdb::unique_ptr<bool[],std::default_delete<bool>,false>::
unique_ptr<bool*,std::default_delete<bool[]>,void,bool>
          (unique_ptr<bool[],_std::default_delete<bool>,_false> *this,bool *param_2)

{
  unique_ptr<bool[],_std::default_delete<bool[]>_> *in_RSI;
  bool *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<bool[],std::default_delete<bool[]>>::
  unique_ptr<bool*,std::default_delete<bool[]>,void,bool>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static inline void AssertNotNull(const bool null) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(null)) {
			throw duckdb::InternalException("Attempted to dereference unique_ptr that is NULL!");
		}
#endif
	}